

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_byte_array_len_decode
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  cram_codec *pcVar1;
  int iVar2;
  int32_t len;
  int32_t one;
  int local_30 [2];
  
  local_30[1] = 1;
  pcVar1 = (c->field_6).byte_array_len.len_codec;
  (*pcVar1->decode)(slice,pcVar1,in,(char *)local_30,local_30 + 1);
  pcVar1 = (c->field_6).byte_array_len.value_codec;
  if (pcVar1 == (cram_codec *)0x0) {
    iVar2 = -1;
  }
  else {
    (*pcVar1->decode)(slice,pcVar1,in,out,local_30);
    *out_size = local_30[0];
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int cram_byte_array_len_decode(cram_slice *slice, cram_codec *c,
			       cram_block *in, char *out,
			       int *out_size) {
    /* Fetch length */
    int32_t len, one = 1;

    c->byte_array_len.len_codec->decode(slice, c->byte_array_len.len_codec, in, (char *)&len, &one);
    //printf("ByteArray Len=%d\n", len);

    if (c->byte_array_len.value_codec) {
	c->byte_array_len.value_codec->decode(slice,
					      c->byte_array_len.value_codec,
					      in, out, &len);
    } else {
	return -1;
    }

    *out_size = len;

    return 0;
}